

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

float baryonyx::itm::compute_delta<float,baryonyx::itm::default_cost_type<float>>
                (context *ctx,default_cost_type<float> *c,float theta,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  float ret;
  float mini;
  float local_2c;
  float local_28;
  float local_24;
  undefined1 extraout_var [60];
  
  local_24 = theta;
  info<>(ctx,"  - delta not defined, compute it:\n");
  auVar2._0_4_ = default_cost_type<float>::min(c,n);
  auVar2._4_60_ = extraout_var;
  auVar1 = vfnmadd132ss_fma(auVar2._0_16_,auVar2._0_16_,ZEXT416((uint)theta));
  local_2c = auVar1._0_4_;
  local_28 = auVar2._0_4_;
  info<float,float,float>
            (ctx,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_2c,&local_28,
             &local_24);
  return local_2c;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}